

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O1

ostream * operator<<(ostream *strm,Person *obj)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(strm,"name: ",6);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (strm,(obj->name)._M_dataplus._M_p,(obj->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nid: ",5);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(obj->id)._M_dataplus._M_p,(obj->id)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\naddress: ",10);
  operator<<(poVar1,&obj->address);
  return strm;
}

Assistant:

ostream &operator<<(ostream &strm, const Person &obj) {
    strm << "name: " << obj.name << "\nid: " << obj.id << "\naddress: " << obj.address;
    return strm;
}